

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloomFilterTest.cpp
# Opt level: O0

BloomFilter<supermap::Key<1UL>_> * getFilterWithErrorProbability<1ul>(double errorProbability)

{
  BloomFilter<supermap::Key<1UL>_> *in_RDI;
  unique_ptr<supermap::Hasher,_std::default_delete<supermap::Hasher>_> hasher;
  unique_ptr<supermap::Hasher,_std::default_delete<supermap::Hasher>_> *in_stack_00001dd0;
  double in_stack_00001dd8;
  BloomFilter<supermap::Key<1UL>_> *in_stack_00001de0;
  unique_ptr<supermap::XXHasher,_std::default_delete<supermap::XXHasher>_> *__u;
  BloomFilter<supermap::Key<1UL>_> *this;
  unique_ptr<supermap::XXHasher,_std::default_delete<supermap::XXHasher>_> local_20 [4];
  
  __u = local_20;
  this = in_RDI;
  std::make_unique<supermap::XXHasher>();
  std::unique_ptr<supermap::Hasher,std::default_delete<supermap::Hasher>>::
  unique_ptr<supermap::XXHasher,std::default_delete<supermap::XXHasher>,void>
            ((unique_ptr<supermap::Hasher,_std::default_delete<supermap::Hasher>_> *)this,__u);
  std::unique_ptr<supermap::XXHasher,_std::default_delete<supermap::XXHasher>_>::~unique_ptr
            ((unique_ptr<supermap::XXHasher,_std::default_delete<supermap::XXHasher>_> *)in_RDI);
  supermap::BloomFilter<supermap::Key<1UL>_>::BloomFilter
            (in_stack_00001de0,in_stack_00001dd8,in_stack_00001dd0);
  std::unique_ptr<supermap::Hasher,_std::default_delete<supermap::Hasher>_>::~unique_ptr
            ((unique_ptr<supermap::Hasher,_std::default_delete<supermap::Hasher>_> *)in_RDI);
  return in_RDI;
}

Assistant:

supermap::BloomFilter<supermap::Key<Len>> getFilterWithErrorProbability(double errorProbability) {
    std::unique_ptr<supermap::Hasher> hasher = std::make_unique<supermap::XXHasher>();
    return supermap::BloomFilter<supermap::Key<Len>>(errorProbability, std::move(hasher));
}